

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Entity_State_Update_PDU.cpp
# Opt level: O2

KBOOL __thiscall
KDIS::PDU::Entity_State_Update_PDU::operator==
          (Entity_State_Update_PDU *this,Entity_State_Update_PDU *Value)

{
  KBOOL KVar1;
  bool bVar2;
  
  KVar1 = Header7::operator!=(&this->super_Header,&Value->super_Header);
  if ((((!KVar1) &&
       (KVar1 = DATA_TYPE::EntityIdentifier::operator!=(&this->m_EntityID,&Value->m_EntityID),
       !KVar1)) && (this->m_ui8NumOfVariableParams == Value->m_ui8NumOfVariableParams)) &&
     (((KVar1 = DATA_TYPE::Vector::operator!=
                          (&this->m_EntityLinearVelocity,&Value->m_EntityLinearVelocity), !KVar1 &&
       (KVar1 = DATA_TYPE::WorldCoordinates::operator!=
                          (&this->m_EntityLocation,&Value->m_EntityLocation), !KVar1)) &&
      ((KVar1 = DATA_TYPE::EulerAngles::operator!=
                          (&this->m_EntityOrientation,&Value->m_EntityOrientation), !KVar1 &&
       (KVar1 = DATA_TYPE::EntityAppearance::operator!=
                          (&this->m_EntityAppearance,&Value->m_EntityAppearance), !KVar1)))))) {
    bVar2 = std::operator!=(&this->m_vVariableParameters,&Value->m_vVariableParameters);
    return !bVar2;
  }
  return false;
}

Assistant:

KBOOL Entity_State_Update_PDU::operator == ( const Entity_State_Update_PDU & Value ) const
{
    if( Header::operator         !=( Value ) )                       return false;
    if( m_EntityID               != Value.m_EntityID )               return false;
    if( m_ui8NumOfVariableParams != Value.m_ui8NumOfVariableParams ) return false;
    if( m_EntityLinearVelocity   != Value.m_EntityLinearVelocity )   return false;
    if( m_EntityLocation         != Value.m_EntityLocation )         return false;
    if( m_EntityOrientation      != Value.m_EntityOrientation )      return false;
    if( m_EntityAppearance       != Value.m_EntityAppearance )       return false;
    if( m_vVariableParameters    != Value.m_vVariableParameters )    return false;
    return true;
}